

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polar_extent_simd.hpp
# Opt level: O1

void __thiscall
ear::PolarExtentCoreSimd<xsimd::avx512bw>::run
          (PolarExtentCoreSimd<xsimd::avx512bw> *this,PolarExtentCoreContext *ctx)

{
  extent_float_t eVar1;
  batch cos_angle;
  size_t sVar2;
  size_t sVar3;
  extent_float_t *peVar4;
  undefined8 uVar5;
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  PositionBatch<xsimd::batch<float,_xsimd::avx512bw>_> *position;
  ulong uVar8;
  PolarExtentCoreContext *extraout_RDX;
  PolarExtentCoreContext *extraout_RDX_00;
  PolarExtentCoreContext *extraout_RDX_01;
  PolarExtentCoreContext *ctx_00;
  undefined1 (*pauVar9) [64];
  long lVar10;
  size_t sVar11;
  long lVar12;
  ulong uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [16];
  PositionBatch<xsimd::batch<float,_xsimd::avx512bw>_> pos;
  
  ctx_00 = (PolarExtentCoreContext *)ctx->num_speakers;
  if (ctx_00 != (PolarExtentCoreContext *)0x0) {
    memset(ctx->results,0,(long)ctx_00 << 2);
    ctx_00 = extraout_RDX;
  }
  if (ctx->num_points != 0) {
    lVar12 = 0;
    uVar13 = 0;
    do {
      if (((ulong)(ctx->xs + uVar13) & 0x3f) != 0) {
LAB_0014a962:
        __assert_fail("((reinterpret_cast<uintptr_t>(mem) % A::alignment()) == 0) && \"loaded pointer is not properly aligned\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/xsimd/include/xsimd/types/xsimd_batch.hpp"
                      ,0x268,
                      "static batch<T, A> xsimd::batch<float>::load_aligned(const U *) [T = float, A = xsimd::avx512bw, U = float]"
                     );
      }
      cos_angle.super_simd_register<float,_xsimd::avx512bw>.
      super_simd_register<float,_xsimd::avx512dq>.super_simd_register<float,_xsimd::avx512cd>.
      super_simd_register<float,_xsimd::avx512f>.data =
           *(simd_register<float,_xsimd::avx512bw> *)
            &((simd_register<float,_xsimd::avx512bw> *)(ctx->xs + uVar13))->
             super_simd_register<float,_xsimd::avx512dq>;
      position = (PositionBatch<xsimd::batch<float,_xsimd::avx512bw>_> *)(ctx->ys + uVar13);
      if (((ulong)position & 0x3f) != 0) goto LAB_0014a962;
      if (((ulong)(ctx->zs + uVar13) & 0x3f) != 0) goto LAB_0014a962;
      auVar17 = *(undefined1 (*) [64])(ctx->zs + uVar13);
      if (ctx->is_circular == true) {
        eVar1 = ctx->flippedBasis[5];
        auVar16._4_4_ = eVar1;
        auVar16._0_4_ = eVar1;
        auVar16._8_4_ = eVar1;
        auVar16._12_4_ = eVar1;
        auVar16._16_4_ = eVar1;
        auVar16._20_4_ = eVar1;
        auVar16._24_4_ = eVar1;
        auVar16._28_4_ = eVar1;
        auVar16._32_4_ = eVar1;
        auVar16._36_4_ = eVar1;
        auVar16._40_4_ = eVar1;
        auVar16._44_4_ = eVar1;
        auVar16._48_4_ = eVar1;
        auVar16._52_4_ = eVar1;
        auVar16._56_4_ = eVar1;
        auVar16._60_4_ = eVar1;
        auVar16 = vmulps_avx512f(auVar17,auVar16);
        eVar1 = ctx->flippedBasis[4];
        auVar17._4_4_ = eVar1;
        auVar17._0_4_ = eVar1;
        auVar17._8_4_ = eVar1;
        auVar17._12_4_ = eVar1;
        auVar17._16_4_ = eVar1;
        auVar17._20_4_ = eVar1;
        auVar17._24_4_ = eVar1;
        auVar17._28_4_ = eVar1;
        auVar17._32_4_ = eVar1;
        auVar17._36_4_ = eVar1;
        auVar17._40_4_ = eVar1;
        auVar17._44_4_ = eVar1;
        auVar17._48_4_ = eVar1;
        auVar17._52_4_ = eVar1;
        auVar17._56_4_ = eVar1;
        auVar17._60_4_ = eVar1;
        auVar17 = vfmadd231ps_avx512f(auVar16,*(undefined1 (*) [64])
                                               (position->x).
                                               super_simd_register<float,_xsimd::avx512bw>.
                                               super_simd_register<float,_xsimd::avx512dq>.
                                               super_simd_register<float,_xsimd::avx512cd>.
                                               super_simd_register<float,_xsimd::avx512f>.data,
                                      auVar17);
        eVar1 = ctx->flippedBasis[3];
        auVar6._4_4_ = eVar1;
        auVar6._0_4_ = eVar1;
        auVar6._8_4_ = eVar1;
        auVar6._12_4_ = eVar1;
        auVar6._16_4_ = eVar1;
        auVar6._20_4_ = eVar1;
        auVar6._24_4_ = eVar1;
        auVar6._28_4_ = eVar1;
        auVar6._32_4_ = eVar1;
        auVar6._36_4_ = eVar1;
        auVar6._40_4_ = eVar1;
        auVar6._44_4_ = eVar1;
        auVar6._48_4_ = eVar1;
        auVar6._52_4_ = eVar1;
        auVar6._56_4_ = eVar1;
        auVar6._60_4_ = eVar1;
        auVar17 = vfmadd231ps_avx512f(auVar17,(undefined1  [64])
                                              cos_angle.super_simd_register<float,_xsimd::avx512bw>.
                                              super_simd_register<float,_xsimd::avx512dq>.
                                              super_simd_register<float,_xsimd::avx512cd>.
                                              super_simd_register<float,_xsimd::avx512f>.data,auVar6
                                     );
        weight_from_cos((batch *)this,(PolarExtentCoreSimd<xsimd::avx512bw> *)ctx,ctx_00,cos_angle);
        ctx_00 = extraout_RDX_00;
      }
      else {
        weight_stadium((batch *)this,(PolarExtentCoreSimd<xsimd::avx512bw> *)ctx,
                       (PolarExtentCoreContext *)&stack0xfffffffffffffec0,position);
        ctx_00 = extraout_RDX_01;
      }
      auVar7._8_4_ = 0x3f800000;
      auVar7._0_8_ = 0x3f8000003f800000;
      auVar7._12_4_ = 0x3f800000;
      auVar7._16_4_ = 0x3f800000;
      auVar7._20_4_ = 0x3f800000;
      auVar7._24_4_ = 0x3f800000;
      auVar7._28_4_ = 0x3f800000;
      auVar7._32_4_ = 0x3f800000;
      auVar7._36_4_ = 0x3f800000;
      auVar7._40_4_ = 0x3f800000;
      auVar7._44_4_ = 0x3f800000;
      auVar7._48_4_ = 0x3f800000;
      auVar7._52_4_ = 0x3f800000;
      auVar7._56_4_ = 0x3f800000;
      auVar7._60_4_ = 0x3f800000;
      uVar5 = vcmpps_avx512f(auVar17,auVar7,4);
      if ((short)uVar5 == 0) {
        ctx_00 = (PolarExtentCoreContext *)ctx->num_speakers;
        if (ctx_00 != (PolarExtentCoreContext *)0x0) {
          uVar8 = 0;
          do {
            if ((((ulong)(ctx->summed_panning_results + uVar8 + (long)ctx_00 * (uVar13 >> 4)) & 0x3f
                 ) != 0) ||
               (pauVar9 = (undefined1 (*) [64])(ctx->results + uVar8), ((ulong)pauVar9 & 0x3f) != 0)
               ) goto LAB_0014a962;
            auVar17 = vaddps_avx512f(*(undefined1 (*) [64])
                                      (ctx->summed_panning_results +
                                      uVar8 + (long)ctx_00 * (uVar13 >> 4)),*pauVar9);
            *pauVar9 = auVar17;
            uVar8 = uVar8 + 0x10;
            ctx_00 = (PolarExtentCoreContext *)ctx->num_speakers;
          } while (uVar8 < ctx_00);
        }
      }
      else {
        uVar5 = vcmpps_avx512f(auVar17,_DAT_001cce40,4);
        if (((short)uVar5 != 0) && (sVar2 = ctx->real_num_speakers, sVar2 != 0)) {
          sVar3 = ctx->num_points;
          ctx_00 = (PolarExtentCoreContext *)ctx->panning_results;
          peVar4 = ctx->results;
          sVar11 = 0;
          lVar10 = lVar12;
          do {
            if (((int)ctx_00 + (int)lVar10 & 0x3fU) != 0) goto LAB_0014a962;
            auVar16 = vmulps_avx512f(auVar17,*(undefined1 (*) [64])
                                              ((long)ctx_00->flippedBasis + lVar10 + -0x44));
            auVar14 = vextractf32x4_avx512f(auVar16,2);
            auVar15 = vextractf32x4_avx512f(auVar16,3);
            auVar18._0_4_ = auVar16._0_4_ + auVar16._16_4_ + auVar14._0_4_ + auVar15._0_4_;
            auVar18._4_4_ = auVar16._4_4_ + auVar16._20_4_ + auVar14._4_4_ + auVar15._4_4_;
            auVar18._8_4_ = auVar16._8_4_ + auVar16._24_4_ + auVar14._8_4_ + auVar15._8_4_;
            auVar18._12_4_ = auVar16._12_4_ + auVar16._28_4_ + auVar14._12_4_ + auVar15._12_4_;
            auVar14 = vhaddps_avx(auVar18,auVar18);
            auVar14 = vhaddps_avx(auVar14,auVar14);
            peVar4[sVar11] = auVar14._0_4_ + peVar4[sVar11];
            sVar11 = sVar11 + 1;
            lVar10 = lVar10 + sVar3 * 4;
          } while (sVar2 != sVar11);
        }
      }
      uVar13 = uVar13 + 0x10;
      lVar12 = lVar12 + 0x40;
    } while (uVar13 < ctx->num_points);
  }
  return;
}

Assistant:

void run(PolarExtentCoreContext &ctx) const override {
      for (size_t speaker_idx = 0; speaker_idx < ctx.num_speakers;
           speaker_idx++)
        ctx.results[speaker_idx] = 0.0;

      for (size_t i = 0; i < ctx.num_points; i += batch::size) {
        PositionBatch<batch> pos;
        pos.x = batch::load_aligned(ctx.xs + i);
        pos.y = batch::load_aligned(ctx.ys + i);
        pos.z = batch::load_aligned(ctx.zs + i);

        batch weight = ctx.is_circular ? weight_circle(ctx, pos)
                                       : weight_stadium(ctx, pos);

        bool all_zeros = xsimd::all(weight == 0.0);
        bool all_ones = xsimd::all(weight == 1.0);
        if (all_ones) {
          // add pre-computed sum for this batch
          size_t batch_i = i / batch::size;
          for (size_t speaker_idx = 0; speaker_idx < ctx.num_speakers;
               speaker_idx += batch::size) {
            batch gain =
                batch::load_aligned(ctx.summed_panning_results +
                                    (batch_i * ctx.num_speakers) + speaker_idx);

            extent_float_t *result_ptr = ctx.results + speaker_idx;
            xsimd::store_aligned(result_ptr,
                                 batch::load_aligned(result_ptr) + gain);
          }
        } else if (!all_zeros) {
          for (size_t speaker_idx = 0; speaker_idx < ctx.real_num_speakers;
               speaker_idx++) {
            batch gain = batch::load_aligned(ctx.panning_results +
                                             speaker_idx * ctx.num_points + i);
            ctx.results[speaker_idx] += xsimd::reduce_add(gain * weight);
          }
        }
      }
    }